

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  ExceptionImpl *pEVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  ExceptionImpl **ppEVar5;
  ExceptionImpl *pEVar6;
  long *in_FS_OFFSET;
  Fault f;
  Fault local_10;
  
  *(undefined ***)this = &PTR__ExceptionImpl_0028f0e8;
  anon_unknown_70::validateExceptionPointer(this->nextCurrentException);
  pEVar1 = (ExceptionImpl *)in_FS_OFFSET[-2];
  if (pEVar1 != (ExceptionImpl *)0x0) {
    if (pEVar1 == this) {
      ppEVar5 = (ExceptionImpl **)(*in_FS_OFFSET + -0x10);
    }
    else {
      do {
        pEVar6 = pEVar1;
        pEVar1 = pEVar6->nextCurrentException;
        if (pEVar1 == (ExceptionImpl *)0x0) goto LAB_001de707;
      } while (pEVar1 != this);
      ppEVar5 = &pEVar6->nextCurrentException;
    }
    *ppEVar5 = this->nextCurrentException;
    pcVar2 = (this->whatBuffer).content.ptr;
    if (pcVar2 != (char *)0x0) {
      sVar3 = (this->whatBuffer).content.size_;
      (this->whatBuffer).content.ptr = (char *)0x0;
      (this->whatBuffer).content.size_ = 0;
      pAVar4 = (this->whatBuffer).content.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
    }
    std::exception::~exception(&this->super_exception);
    Exception::~Exception(&this->super_Exception);
    return;
  }
LAB_001de707:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x48a,FAILED,(char *)0x0,"\"ExceptionImpl not found on currentException list?\"",
             (char (*) [50])"ExceptionImpl not found on currentException list?");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

~ExceptionImpl() noexcept {
    // Look for ourselves in the list.
    validateExceptionPointer(nextCurrentException);
    for (auto* ptr = &currentException; *ptr != nullptr; ptr = &(*ptr)->nextCurrentException) {
      if (*ptr == this) {
        *ptr = nextCurrentException;
        return;
      }
    }

    // Possibly the ExceptionImpl was destroyed on a different thread than created it? That's
    // pretty bad, we'd better abort.
    KJ_FAIL_ASSERT("ExceptionImpl not found on currentException list?");
  }